

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O2

int __thiscall deqp::gls::ShaderPerformanceCase::init(ShaderPerformanceCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  TestLog *log;
  RenderContext *renderCtx;
  InitialCalibration *pIVar2;
  int extraout_EAX;
  int iVar3;
  int iVar4;
  ShaderProgram *this_01;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  size_t in_RCX;
  void *__buf;
  allocator<char> local_3b6;
  allocator<char> local_3b5;
  int local_3b4;
  string local_3b0;
  string local_390;
  LogSection local_370;
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  int *piVar5;
  
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_renderCtx;
  glu::makeVtxFragSources
            ((ProgramSources *)&local_330,&this->m_vertShaderSource,&this->m_fragShaderSource);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)&local_330);
  this->m_program = this_01;
  glu::ProgramSources::~ProgramSources((ProgramSources *)&local_330);
  if ((this->m_program->m_program).m_info.linkOk == true) {
    pIVar2 = (this->m_initialCalibration).m_ptr;
    if (pIVar2 == (InitialCalibration *)0x0) {
      iVar4 = 1;
    }
    else {
      iVar4 = pIVar2->initialNumCalls;
    }
    iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    piVar5 = (int *)CONCAT44(extraout_var,iVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"RenderTarget",&local_3b5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"Render target",&local_3b6);
    tcu::LogSection::LogSection(&local_370,&local_390,&local_3b0);
    tcu::LogSection::write(&local_370,(int)log,__buf,in_RCX);
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"size: ");
    std::ostream::operator<<(poVar1,*piVar5);
    std::operator<<((ostream *)poVar1,"x");
    local_3b4 = iVar4;
    std::ostream::operator<<(poVar1,piVar5[1]);
    local_330.m_log =
         tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    this_00 = &local_330.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"bits:");
    std::operator<<((ostream *)this_00," R");
    pMVar6 = tcu::MessageBuilder::operator<<(&local_330,piVar5 + 2);
    std::operator<<((ostream *)&pMVar6->m_str," G");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,piVar5 + 3);
    std::operator<<((ostream *)&pMVar6->m_str," B");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,piVar5 + 4);
    std::operator<<((ostream *)&pMVar6->m_str," A");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,piVar5 + 5);
    poVar1 = &pMVar6->m_str;
    std::operator<<((ostream *)poVar1," D");
    std::ostream::operator<<(poVar1,piVar5[6]);
    std::operator<<((ostream *)poVar1," S");
    std::ostream::operator<<(poVar1,piVar5[7]);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    tcu::LogSection::~LogSection(&local_370);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    local_330.m_log = log;
    if (piVar5[8] == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330.m_str);
      std::operator<<((ostream *)&local_330.m_str,"No MSAA");
      tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar1 = &local_330.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::ostream::operator<<(poVar1,piVar5[8]);
      std::operator<<((ostream *)poVar1,"x MSAA");
      tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330.m_str);
    tcu::TestLog::endSection(log);
    ShaderPerformanceMeasurer::init
              (&this->m_measurer,(EVP_PKEY_CTX *)(ulong)(this->m_program->m_program).m_program);
    ShaderPerformanceMeasurer::logParameters(&this->m_measurer,log);
    glu::operator<<(log,this->m_program);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
              (this,(ulong)(this->m_program->m_program).m_program);
    iVar4 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])(this);
  }
  else {
    glu::operator<<(log,this->m_program);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Compile failed")
    ;
    iVar4 = extraout_EAX;
  }
  return iVar4;
}

Assistant:

void ShaderPerformanceCase::init (void)
{
	tcu::TestLog& log = m_testCtx.getLog();

	m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(m_vertShaderSource, m_fragShaderSource));

	if (m_program->isOk())
	{
		const int initialCallCount = m_initialCalibration ? m_initialCalibration->initialNumCalls : 1;
		logRenderTargetInfo(log, m_renderCtx.getRenderTarget());
		m_measurer.init(m_program->getProgram(), m_attributes, initialCallCount);
		m_measurer.logParameters(log);
		log << *m_program;
	}
	else
	{
		log << *m_program;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return; // Skip rest of init.
	}

	setupProgram(m_program->getProgram());
	setupRenderState();
}